

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createGeometryPassthroughTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"passthrough",
             "Render various types with either passthrough geometry or tessellation shader");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr();
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase
                     ((TestContext *)
                      group.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,TESSPRIMITIVETYPE_TRIANGLES);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase
                     ((TestContext *)
                      group.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,TESSPRIMITIVETYPE_QUADS);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase
                     ((TestContext *)
                      group.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,TESSPRIMITIVETYPE_ISOLINES);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)
           anon_unknown_2::makeIdentityTessellationShaderCase
                     ((TestContext *)
                      group.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,TESSPRIMITIVETYPE_TRIANGLES);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)
           anon_unknown_2::makeIdentityTessellationShaderCase
                     ((TestContext *)
                      group.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,TESSPRIMITIVETYPE_ISOLINES);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createGeometryPassthroughTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "passthrough", "Render various types with either passthrough geometry or tessellation shader"));

	// Passthrough geometry shader
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_TRIANGLES));
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_QUADS));
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_ISOLINES));

	// Passthrough tessellation shader
	group->addChild(makeIdentityTessellationShaderCase(testCtx, TESSPRIMITIVETYPE_TRIANGLES));
	group->addChild(makeIdentityTessellationShaderCase(testCtx, TESSPRIMITIVETYPE_ISOLINES));

	return group.release();
}